

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

_Bool cpu_breakpoint_test(CPUState *cpu,vaddr pc,int mask)

{
  CPUBreakpoint *pCVar1;
  _Bool _Var2;
  
  pCVar1 = (cpu->breakpoints).tqh_first;
  if (pCVar1 == (CPUBreakpoint *)0x0) {
    _Var2 = false;
  }
  else {
    for (; (_Var2 = pCVar1 != (CPUBreakpoint *)0x0, _Var2 &&
           ((pCVar1->pc != pc || ((pCVar1->flags & mask) == 0)))); pCVar1 = (pCVar1->entry).tqe_next
        ) {
    }
  }
  return _Var2;
}

Assistant:

static inline bool cpu_breakpoint_test(CPUState *cpu, vaddr pc, int mask)
{
    CPUBreakpoint *bp;

    if (unlikely(!QTAILQ_EMPTY(&cpu->breakpoints))) {
        QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
            if (bp->pc == pc && (bp->flags & mask)) {
                return true;
            }
        }
    }
    return false;
}